

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooling_2x2.h
# Opt level: O0

void ncnn::pooling2x2s2_max_avx(Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  float *pfVar4;
  long *in_RSI;
  long *in_RDI;
  float max1;
  float max0;
  __m128 _max;
  __m128 _max_1;
  __m128 _max_0;
  __m256 _max_r0_r1;
  __m256 _r1;
  __m256 _r0;
  int remain;
  int nn;
  int i;
  __m256i permute_mask;
  float *r1;
  float *r0;
  int outcount;
  float *outptr;
  float *img0;
  int q;
  int tailstep;
  int outh;
  int outw;
  int inch;
  int w;
  Mat *m;
  Mat *m_1;
  float local_518;
  float local_514;
  undefined1 local_510 [16];
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 local_4f0;
  undefined8 uStack_4e8;
  undefined1 local_4e0 [32];
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  int local_46c;
  int local_468;
  int local_464;
  undefined1 local_460 [32];
  undefined1 (*local_438) [32];
  undefined1 (*local_430) [32];
  int local_424;
  undefined8 local_420;
  undefined8 local_418;
  undefined8 local_410;
  undefined4 local_408;
  long local_400;
  undefined4 local_3f8;
  undefined4 local_3f4;
  undefined4 local_3f0;
  undefined4 local_3ec;
  undefined4 local_3e8;
  undefined8 local_3e0;
  undefined1 (*local_3d8) [16];
  undefined8 local_3c0;
  undefined8 local_3b8;
  undefined8 local_3b0;
  undefined4 local_3a8;
  long local_3a0;
  undefined4 local_398;
  undefined4 local_394;
  undefined4 local_390;
  undefined4 local_38c;
  undefined4 local_388;
  undefined8 local_380;
  undefined1 (*local_378) [32];
  int local_370;
  int local_36c;
  int local_368;
  int local_364;
  int local_360;
  int local_35c;
  long *local_350;
  long *local_348;
  undefined1 local_33d;
  int local_33c;
  undefined8 *local_330;
  undefined8 *local_328;
  undefined8 *local_318;
  undefined8 *local_308;
  undefined8 *local_2f8;
  undefined1 local_2ed;
  int local_2ec;
  undefined8 *local_2e0;
  undefined1 (*local_2d0) [32];
  undefined1 (*local_2c8) [32];
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 local_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined1 (*local_248) [16];
  long local_240;
  undefined4 local_234;
  long local_230;
  undefined1 (*local_228) [16];
  undefined4 local_21c;
  int local_218;
  int local_214;
  undefined8 *local_210;
  long local_208;
  undefined4 local_1fc;
  long local_1f8;
  undefined1 (*local_1f0) [32];
  undefined4 local_1e4;
  int local_1e0;
  int local_1dc;
  undefined8 *local_1d8;
  undefined4 local_1cc;
  long local_1c8;
  undefined4 local_1bc;
  long local_1b8;
  undefined8 *local_188;
  undefined8 *local_168;
  undefined4 local_120;
  undefined4 local_11c;
  undefined4 local_118;
  undefined4 local_114;
  undefined4 local_110;
  undefined4 local_10c;
  undefined4 local_108;
  undefined4 local_104;
  undefined1 local_100 [32];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined1 local_80 [32];
  undefined4 local_50;
  undefined4 local_4c;
  undefined4 local_48;
  undefined4 local_44;
  undefined4 local_40;
  undefined4 local_3c;
  undefined4 local_38;
  undefined4 local_34;
  
  local_35c = *(int *)((long)in_RDI + 0x2c);
  local_360 = (int)in_RDI[7];
  local_364 = *(int *)((long)in_RSI + 0x2c);
  local_368 = (int)in_RSI[6];
  local_36c = local_35c * 2 + local_364 * -2;
  local_350 = in_RSI;
  local_348 = in_RDI;
  for (local_370 = 0; local_370 < local_360; local_370 = local_370 + 1) {
    local_330 = &local_3c0;
    local_1dc = *(int *)((long)local_348 + 0x2c);
    local_1e0 = (int)local_348[6];
    local_1e4 = *(undefined4 *)((long)local_348 + 0x34);
    local_430 = (undefined1 (*) [32])(*local_348 + local_348[8] * (long)local_370 * local_348[2]);
    local_1f8 = local_348[2];
    local_1fc = (undefined4)local_348[3];
    local_208 = local_348[4];
    local_1d8 = &local_3c0;
    local_1c8 = (long)local_1dc * (long)local_1e0 * local_1f8;
    local_328 = &local_3c0;
    local_318 = &local_3c0;
    local_2e0 = &local_420;
    local_214 = *(int *)((long)local_350 + 0x2c);
    local_218 = (int)local_350[6];
    local_21c = *(undefined4 *)((long)local_350 + 0x34);
    local_3d8 = (undefined1 (*) [16])(*local_350 + local_350[8] * (long)local_370 * local_350[2]);
    local_230 = local_350[2];
    local_234 = (undefined4)local_350[3];
    local_240 = local_350[4];
    local_210 = &local_420;
    local_1b8 = (long)local_214 * (long)local_218 * local_230;
    local_2f8 = &local_420;
    local_308 = &local_420;
    local_388 = 0;
    local_38c = 0;
    local_390 = 0;
    local_394 = 0;
    local_3a8 = 0;
    local_3b0 = 0;
    local_3b8 = 0;
    local_3c0 = 0;
    local_1bc = 0x10;
    local_1cc = 0x10;
    local_2ec = local_370;
    local_2ed = 1;
    local_33c = local_370;
    local_33d = 1;
    local_380 = 0;
    local_398 = 0;
    local_420 = 0;
    local_410 = 0;
    local_408 = 0;
    local_3f8 = 0;
    local_3f4 = 0;
    local_3f0 = 0;
    local_3ec = 0;
    local_3e8 = 0;
    local_3e0 = 0;
    local_418 = 0;
    local_424 = 0;
    local_438 = (undefined1 (*) [32])(*local_430 + (long)local_35c * 4);
    local_104 = 0;
    local_108 = 2;
    local_10c = 4;
    local_110 = 6;
    local_114 = 1;
    local_118 = 3;
    local_11c = 5;
    local_120 = 7;
    local_34 = 7;
    local_38 = 5;
    local_3c = 3;
    local_40 = 1;
    local_44 = 6;
    local_48 = 4;
    local_4c = 2;
    local_50 = 0;
    auVar2 = vpinsrd_avx(ZEXT416(1),3,1);
    auVar2 = vpinsrd_avx(auVar2,5,2);
    auVar2 = vpinsrd_avx(auVar2,7,3);
    auVar3 = vpinsrd_avx(ZEXT416(0),2,1);
    auVar3 = vpinsrd_avx(auVar3,4,2);
    auVar3 = vpinsrd_avx(auVar3,6,3);
    local_460._0_16_ = ZEXT116(0) * auVar2 + ZEXT116(1) * auVar3;
    local_460._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar2;
    local_378 = local_430;
    local_228 = local_3d8;
    local_1f0 = local_430;
    local_188 = local_308;
    local_168 = local_318;
    local_80 = local_460;
    local_400 = local_240;
    local_3a0 = local_208;
    for (local_464 = 0; local_464 < local_368; local_464 = local_464 + 1) {
      local_468 = local_364 >> 2;
      local_46c = local_364 + local_468 * -4;
      for (; 0 < local_468; local_468 = local_468 + -1) {
        local_2c8 = local_430;
        local_4a0 = *(undefined8 *)*local_430;
        uStack_498 = *(undefined8 *)(*local_430 + 8);
        uStack_490 = *(undefined8 *)(*local_430 + 0x10);
        uStack_488 = *(undefined8 *)(*local_430 + 0x18);
        local_2d0 = local_438;
        local_4c0 = *(undefined8 *)*local_438;
        uStack_4b8 = *(undefined8 *)(*local_438 + 8);
        uStack_4b0 = *(undefined8 *)(*local_438 + 0x10);
        uStack_4a8 = *(undefined8 *)(*local_438 + 0x18);
        auVar1 = vmaxps_avx(*local_430,*local_438);
        local_4e0._0_8_ = auVar1._0_8_;
        local_a0 = local_4e0._0_8_;
        local_4e0._8_8_ = auVar1._8_8_;
        uStack_98 = local_4e0._8_8_;
        local_4e0._16_8_ = auVar1._16_8_;
        uStack_90 = local_4e0._16_8_;
        local_4e0._24_8_ = auVar1._24_8_;
        uStack_88 = local_4e0._24_8_;
        local_c0 = local_4e0._0_8_;
        uStack_b8 = local_4e0._8_8_;
        uStack_b0 = local_4e0._16_8_;
        uStack_a8 = local_4e0._24_8_;
        local_e0 = local_460._0_8_;
        uStack_d8 = local_460._8_8_;
        uStack_d0 = local_460._16_8_;
        uStack_c8 = local_460._24_8_;
        local_4e0 = vpermd_avx2(local_460,auVar1);
        local_100._0_8_ = local_4e0._0_8_;
        local_100._24_8_ = local_4e0._24_8_;
        local_4f0 = local_100._0_8_;
        uStack_4e8 = local_4e0._8_8_;
        local_500 = local_4e0._16_8_;
        uStack_4f8 = local_100._24_8_;
        local_270 = local_100._0_8_;
        uStack_268 = local_4e0._8_8_;
        local_280 = local_4e0._16_8_;
        uStack_278 = local_100._24_8_;
        local_510 = vmaxps_avx(local_4e0._0_16_,local_4e0._16_16_);
        local_248 = local_3d8;
        local_260 = local_510._0_8_;
        uStack_258 = local_510._8_8_;
        *local_3d8 = local_510;
        local_430 = local_430 + 1;
        local_438 = local_438 + 1;
        local_3d8 = local_3d8 + 1;
        local_424 = local_424 + 4;
        local_2c0 = local_4c0;
        uStack_2b8 = uStack_4b8;
        uStack_2b0 = uStack_4b0;
        uStack_2a8 = uStack_4a8;
        local_2a0 = local_4a0;
        uStack_298 = uStack_498;
        uStack_290 = uStack_490;
        uStack_288 = uStack_488;
        local_100 = local_4e0;
      }
      for (; 0 < local_46c; local_46c = local_46c + -1) {
        pfVar4 = std::max<float>((float *)local_430,(float *)(*local_430 + 4));
        local_514 = *pfVar4;
        pfVar4 = std::max<float>((float *)local_438,(float *)(*local_438 + 4));
        local_518 = *pfVar4;
        pfVar4 = std::max<float>(&local_514,&local_518);
        *(float *)*local_3d8 = *pfVar4;
        local_430 = (undefined1 (*) [32])(*local_430 + 8);
        local_438 = (undefined1 (*) [32])(*local_438 + 8);
        local_3d8 = (undefined1 (*) [16])(*local_3d8 + 4);
        local_424 = local_424 + 1;
      }
      local_430 = (undefined1 (*) [32])(*local_430 + (long)local_36c * 4);
      local_438 = (undefined1 (*) [32])(*local_438 + (long)local_36c * 4);
    }
  }
  return;
}

Assistant:

static void pooling2x2s2_max_avx(const Mat& bottom_blob, Mat& top_blob,
                                 const Option& opt)
{
    int w = bottom_blob.w;
    int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;

    const int tailstep = w - 2 * outw + w;
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < inch; q++)
    {
        const float* img0 = bottom_blob.channel(q);
        float* outptr = top_blob.channel(q);
        int outcount = 0;
        const float* r0 = img0;
        const float* r1 = img0 + w;
#if __AVX2__
        __m256i permute_mask = _mm256_setr_epi32(0, 2, 4, 6, 1, 3, 5, 7);
#endif // __AVX__

        for (int i = 0; i < outh; i++)
        {
#if __AVX2__
            int nn = outw >> 2;
            int remain = outw - (nn << 2);
#else
            int remain = outw;
#endif // __AVX__

#if __AVX2__
            for (; nn > 0; nn--)
            {
                __m256 _r0 = _mm256_loadu_ps(r0);
                __m256 _r1 = _mm256_loadu_ps(r1);
                __m256 _max_r0_r1 = _mm256_max_ps(_r0, _r1);
                _max_r0_r1 = _mm256_castsi256_ps(_mm256_permutevar8x32_epi32(
                                                     _mm256_castps_si256(_max_r0_r1), permute_mask));
                __m128 _max_0 = _mm256_extractf128_ps(_max_r0_r1, 0);
                __m128 _max_1 = _mm256_extractf128_ps(_max_r0_r1, 1);
                __m128 _max = _mm_max_ps(_max_0, _max_1);
                _mm_storeu_ps(outptr, _max);
                r0 += 8;
                r1 += 8;
                outptr += 4;
                outcount += 4;
            }
#endif // __AVX__
            for (; remain > 0; remain--)
            {
                float max0 = std::max(r0[0], r0[1]);
                float max1 = std::max(r1[0], r1[1]);

                *outptr = std::max(max0, max1);

                r0 += 2;
                r1 += 2;
                outptr++;
                outcount++;
            }
            r0 += tailstep;
            r1 += tailstep;
        }
    }
}